

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O3

void __thiscall unittest::UnitTest::TestParseGenerate2W(UnitTest *this)

{
  bool result;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> os;
  wchar_t *local_1a0;
  long local_190 [2];
  wostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::wostringstream::wostringstream(local_180);
  result = runtest<wchar_t>("test2.ini","test2.output",
                            (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_180);
  Assert::IsTrue(result);
  std::__cxx11::wstringbuf::str();
  Logger::WriteMessage(local_1a0);
  if (local_1a0 != (wchar_t *)local_190) {
    operator_delete(local_1a0,local_190[0] * 4 + 4);
  }
  std::__cxx11::wostringstream::~wostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

TEST_METHOD(TestParseGenerate2W)
		{
			std::basic_ostringstream<wchar_t> os;
			Assert::IsTrue(runtest<wchar_t>("test2.ini", "test2.output", os));
			Logger::WriteMessage(os.str().c_str());
		}